

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void minimalSwapAndFlipIVar_superFast_moreThen5
               (word *pInOut,int iVar,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  word *pInOut_00;
  int iVar1;
  word local_2058;
  word temp [1024];
  int local_4c [2];
  int M [2];
  int DifStartMin;
  int DifStart1;
  int DifStart0;
  int min2;
  int min1;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int nWords_local;
  int iVar_local;
  word *pInOut_local;
  
  _min2 = pCanonPhase;
  pCanonPhase_local = (uint *)pCanonPerm;
  pCanonPerm_local._0_4_ = nWords;
  pCanonPerm_local._4_4_ = iVar;
  _nWords_local = pInOut;
  local_4c[0] = minTemp0_fast_moreThen5(pInOut,iVar,nWords,&DifStartMin);
  local_4c[1] = minTemp1_fast_moreThen5
                          (_nWords_local,pCanonPerm_local._4_4_,(int)pCanonPerm_local,M + 1);
  DifStart0 = minTemp2_fast_moreThen5
                        (_nWords_local,pCanonPerm_local._4_4_,local_4c[0],local_4c[1],
                         (int)pCanonPerm_local,M);
  pInOut_00 = _nWords_local;
  if (DifStartMin == M[1]) {
    if (M[0] < DifStartMin) {
      DifStart1 = minTemp3_fast_moreThen5
                            (_nWords_local,pCanonPerm_local._4_4_,DifStartMin,M[0],3 - local_4c[0],
                             3 - local_4c[1],M + 1);
      if (M[0] < M[1]) {
        arrangeQuoters_superFast_moreThen5
                  (_nWords_local,&local_2058,DifStartMin,local_4c[(int)(DifStart1 + 1U & 1)],
                   local_4c[DifStart1],3 - local_4c[DifStart1],
                   3 - local_4c[(int)(DifStart1 + 1U & 1)],pCanonPerm_local._4_4_,
                   (char *)pCanonPhase_local,_min2);
      }
      else {
        arrangeQuoters_superFast_moreThen5
                  (_nWords_local,&local_2058,DifStartMin,local_4c[DifStart0],
                   local_4c[(int)(DifStart0 + 1U & 1)],3 - local_4c[(int)(DifStart0 + 1U & 1)],
                   3 - local_4c[DifStart0],pCanonPerm_local._4_4_,(char *)pCanonPhase_local,_min2);
      }
    }
    else {
      arrangeQuoters_superFast_moreThen5
                (_nWords_local,&local_2058,M[0],local_4c[DifStart0],
                 local_4c[(int)(DifStart0 + 1U & 1)],3 - local_4c[(int)(DifStart0 + 1U & 1)],
                 3 - local_4c[DifStart0],pCanonPerm_local._4_4_,(char *)pCanonPhase_local,_min2);
    }
  }
  else if ((M[0] < M[1]) || (M[0] < DifStartMin)) {
    if (M[1] < DifStartMin) {
      iVar1 = luckyMax(M[0],DifStartMin);
      arrangeQuoters_superFast_moreThen5
                (pInOut_00,&local_2058,iVar1,local_4c[0],local_4c[1],3 - local_4c[1],3 - local_4c[0]
                 ,pCanonPerm_local._4_4_,(char *)pCanonPhase_local,_min2);
    }
    else {
      iVar1 = luckyMax(M[0],M[1]);
      arrangeQuoters_superFast_moreThen5
                (pInOut_00,&local_2058,iVar1,local_4c[1],local_4c[0],3 - local_4c[0],3 - local_4c[1]
                 ,pCanonPerm_local._4_4_,(char *)pCanonPhase_local,_min2);
    }
  }
  else {
    arrangeQuoters_superFast_moreThen5
              (_nWords_local,&local_2058,M[0],local_4c[DifStart0],
               local_4c[(int)(DifStart0 + 1U & 1)],3 - local_4c[(int)(DifStart0 + 1U & 1)],
               3 - local_4c[DifStart0],pCanonPerm_local._4_4_,(char *)pCanonPhase_local,_min2);
  }
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_moreThen5(word* pInOut, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin;
    int M[2];
    word temp[1024];
//    printf("in minimalSwapAndFlipIVar_superFast_moreThen5\n");
    M[0] = minTemp0_fast_moreThen5(pInOut, iVar, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast_moreThen5(pInOut, iVar, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast_moreThen5(pInOut, iVar, M[0], M[1], nWords, &DifStartMin);
    if(DifStart0 != DifStart1)
    {   
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_moreThen5(pInOut, temp, luckyMax(DifStartMin,DifStart0), M[0], M[1], 3 - M[1], 3 - M[0], iVar, pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_moreThen5(pInOut, temp, luckyMax(DifStartMin,DifStart1), M[1], M[0], 3 - M[0], 3 - M[1], iVar, pCanonPerm, pCanonPhase);
    }
    else
    {
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast_moreThen5(pInOut, iVar, DifStart0, DifStartMin, 3-M[0], 3-M[1], &DifStart1);  // reuse DifStart1 because DifStart1 = DifStart1=0
            if(DifStart1>DifStartMin)
                arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStart0, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], iVar, pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStart0, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, pCanonPerm, pCanonPhase);
        }
    }
//    printf("out minimalSwapAndFlipIVar_superFast_moreThen5\n");

}